

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *p_Var1;
  pointer *ppOVar2;
  pointer pOVar3;
  CleanupFunction p_Var4;
  void *pvVar5;
  Logger *info_log;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  Iterator *pIVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_var;
  _func_int **pp_Var12;
  uint64_t uVar13;
  undefined4 extraout_var_00;
  _func_int *p_Var14;
  long *plVar15;
  char *pcVar16;
  long lVar17;
  Iterator *in_RDX;
  Env *extraout_RDX;
  Env *extraout_RDX_00;
  CleanupFunction p_Var18;
  uint uVar19;
  TableBuilder *pTVar20;
  ulong uVar21;
  bool bVar22;
  long lVar23;
  Status *status;
  string current_user_key;
  ParsedInternalKey ikey;
  LevelSummaryStorage tmp;
  undefined1 local_110 [64];
  Status local_d0;
  Slice local_c8;
  CleanupFunction local_b8;
  uint local_b0;
  size_t local_a8;
  CondVar *local_a0;
  char *local_98;
  Env *local_90;
  
  sVar8 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  pp_Var12 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var12[0x19] - (long)pp_Var12[0x18]) >> 3,(ulong)*(uint *)pp_Var12,
      (ulong)((long)pp_Var12[0x1c] - (long)pp_Var12[0x1b]) >> 3,(ulong)(*(uint *)pp_Var12 + 1));
  iVar7 = VersionSet::NumLevelFiles
                    ((VersionSet *)
                     compact[8].outputs.
                     super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     *(int *)in_RDX->_vptr_Iterator);
  if (iVar7 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37e,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x37f,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  local_a8 = sVar8;
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  pOVar3 = compact[7].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pOVar3 == (pointer)&compact[6].total_bytes) {
    pOVar3 = compact[8].outputs.
             super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  }
  p_Var18 = (CleanupFunction)0xffffffffffffff;
  (in_RDX->cleanup_).function = (CleanupFunction)pOVar3->file_size;
  local_110._56_8_ = compact + 3;
  port::Mutex::Unlock((Mutex *)local_110._56_8_);
  pIVar9 = VersionSet::MakeInputIterator
                     ((VersionSet *)
                      compact[8].outputs.
                      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (Compaction *)in_RDX->_vptr_Iterator);
  (*pIVar9->_vptr_Iterator[3])(pIVar9);
  bVar22 = false;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_c8.data_ = "";
  local_c8.size_ = 0;
  local_110._24_8_ = local_110 + 0x28;
  local_110._32_8_ = (Env *)0x0;
  local_110[0x28] = 0;
  local_a0 = (CondVar *)&compact[3].builder;
  local_110._16_8_ = (_func_int **)0x0;
  while ((iVar7 = (*pIVar9->_vptr_Iterator[2])(pIVar9), (char)iVar7 != '\0' &&
         (compact[3].outfile == (WritableFile *)0x0))) {
    if (compact[4].total_bytes != 0) {
      lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      port::Mutex::Lock((Mutex *)local_110._56_8_);
      if (compact[4].builder != (TableBuilder *)0x0) {
        CompactMemTable((DBImpl *)compact);
        port::CondVar::SignalAll(local_a0);
      }
      port::Mutex::Unlock((Mutex *)local_110._56_8_);
      lVar11 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
      local_110._16_8_ = local_110._16_8_ + (lVar11 - lVar10);
    }
    iVar7 = (*pIVar9->_vptr_Iterator[8])(pIVar9);
    local_98 = (char *)CONCAT44(extraout_var,iVar7);
    local_90 = extraout_RDX;
    bVar6 = Compaction::ShouldStopBefore
                      ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&stack0xffffffffffffff68);
    if (((bVar6) && (in_RDX[1].cleanup_.function != (CleanupFunction)0x0)) &&
       (FinishCompactionOutputFile((DBImpl *)local_110,compact,in_RDX),
       (_func_int **)local_110._0_8_ != (_func_int **)0x0)) {
      pp_Var12 = (_func_int **)Status::CopyState((char *)local_110._0_8_);
      if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
        operator_delete__((void *)local_110._0_8_);
      }
      if (pp_Var12 == (_func_int **)0x0) goto LAB_0010917c;
LAB_001094c0:
      (this->super_DB)._vptr_DB = pp_Var12;
      goto LAB_001094cc;
    }
LAB_0010917c:
    if (local_90 < (Env *)0x8) {
LAB_00109238:
      local_110._32_8_ = (Env *)0x0;
      *(char *)(_func_int ***)local_110._24_8_ = '\0';
      bVar22 = false;
      p_Var18 = (CleanupFunction)0xffffffffffffff;
LAB_00109256:
      pTVar20 = (TableBuilder *)in_RDX[1].cleanup_.function;
      if (pTVar20 == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_110,compact);
        if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
          pp_Var12 = (_func_int **)Status::CopyState((char *)local_110._0_8_);
          if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
            operator_delete__((void *)local_110._0_8_);
          }
          if (pp_Var12 != (_func_int **)0x0) goto LAB_001094c0;
        }
        pTVar20 = (TableBuilder *)in_RDX[1].cleanup_.function;
      }
      uVar13 = TableBuilder::NumEntries(pTVar20);
      if (uVar13 == 0) {
        pvVar5 = (in_RDX->cleanup_).arg2;
        std::__cxx11::string::_M_replace
                  ((long)pvVar5 - 0x40,0,*(char **)((long)pvVar5 + -0x38),(ulong)local_98);
      }
      pvVar5 = (in_RDX->cleanup_).arg2;
      std::__cxx11::string::_M_replace
                ((long)pvVar5 - 0x20,0,*(char **)((long)pvVar5 + -0x18),(ulong)local_98);
      pTVar20 = (TableBuilder *)in_RDX[1].cleanup_.function;
      iVar7 = (*pIVar9->_vptr_Iterator[9])(pIVar9);
      local_110._0_8_ = CONCAT44(extraout_var_00,iVar7);
      local_110._8_8_ = extraout_RDX_00;
      TableBuilder::Add(pTVar20,(Slice *)&stack0xffffffffffffff68,(Slice *)local_110);
      p_Var14 = (_func_int *)TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_.function);
      if ((in_RDX->_vptr_Iterator[1] <= p_Var14) &&
         (FinishCompactionOutputFile((DBImpl *)local_110,compact,in_RDX),
         (_func_int **)local_110._0_8_ != (_func_int **)0x0)) {
        pp_Var12 = (_func_int **)Status::CopyState((char *)local_110._0_8_);
        if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_110._0_8_);
        }
        if (pp_Var12 != (_func_int **)0x0) goto LAB_001094c0;
      }
    }
    else {
      uVar21 = *(ulong *)((long)&((Logger *)((long)local_98 + -8))->_vptr_Logger + (long)local_90);
      local_b0 = (uint)uVar21 & 0xff;
      local_b8 = (CleanupFunction)(uVar21 >> 8);
      local_c8.size_ = (size_t)(local_90 + -1);
      local_c8.data_ = local_98;
      if (1 < local_b0) goto LAB_00109238;
      if (bVar22) {
        pOVar3 = (compact->outputs).
                 super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_110._0_8_ = local_110._24_8_;
        local_110._8_8_ = local_110._32_8_;
        iVar7 = (**(code **)(pOVar3->number + 0x10))(pOVar3,&local_c8,local_110);
        if (iVar7 != 0) goto LAB_001091f0;
      }
      else {
LAB_001091f0:
        std::__cxx11::string::_M_replace
                  ((ulong)(local_110 + 0x18),0,(char *)local_110._32_8_,(ulong)local_c8.data_);
        p_Var18 = (CleanupFunction)0xffffffffffffff;
      }
      p_Var4 = (in_RDX->cleanup_).function;
      if (p_Var4 < p_Var18) {
        if (p_Var4 < local_b8 || local_b0 != 0) {
          bVar22 = true;
          p_Var18 = local_b8;
        }
        else {
          bVar6 = Compaction::IsBaseLevelForKey((Compaction *)in_RDX->_vptr_Iterator,&local_c8);
          bVar22 = true;
          p_Var18 = local_b8;
          if (bVar6) goto LAB_00109372;
        }
        goto LAB_00109256;
      }
      bVar22 = true;
      p_Var18 = local_b8;
    }
LAB_00109372:
    (*pIVar9->_vptr_Iterator[6])(pIVar9);
  }
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  if (compact[3].outfile == (WritableFile *)0x0) {
LAB_0010942b:
    if ((in_RDX[1].cleanup_.function != (CleanupFunction)0x0) &&
       (FinishCompactionOutputFile((DBImpl *)&stack0xffffffffffffff68,compact,in_RDX),
       (Logger *)local_98 != (Logger *)0x0)) {
      pp_Var12 = (_func_int **)Status::CopyState(local_98);
      (this->super_DB)._vptr_DB = pp_Var12;
      if ((Logger *)local_98 != (Logger *)0x0) {
        operator_delete__(local_98);
        pp_Var12 = (this->super_DB)._vptr_DB;
      }
      if (pp_Var12 != (_func_int **)0x0) goto LAB_001094cc;
    }
    (*pIVar9->_vptr_Iterator[10])(&stack0xffffffffffffff68,pIVar9);
    if ((Logger *)local_98 == (Logger *)0x0) {
      pp_Var12 = (_func_int **)0x0;
    }
    else {
      pp_Var12 = (_func_int **)Status::CopyState(local_98);
      (this->super_DB)._vptr_DB = pp_Var12;
      if ((Logger *)local_98 != (Logger *)0x0) {
        operator_delete__(local_98);
      }
    }
  }
  else {
    local_98 = "Deleting DB during compaction";
    local_90 = (Env *)0x1d;
    local_110._0_8_ = "";
    local_110._8_8_ = (Env *)0x0;
    Status::Status(&local_d0,kIOError,(Slice *)&stack0xffffffffffffff68,(Slice *)local_110);
    if ((Env *)local_d0.state_ == (Env *)0x0) goto LAB_0010942b;
    pp_Var12 = (_func_int **)Status::CopyState(local_d0.state_);
    (this->super_DB)._vptr_DB = pp_Var12;
    if ((Env *)local_d0.state_ != (Env *)0x0) {
      operator_delete__(local_d0.state_);
      pp_Var12 = (this->super_DB)._vptr_DB;
    }
    if (pp_Var12 == (_func_int **)0x0) goto LAB_0010942b;
  }
LAB_001094cc:
  (*pIVar9->_vptr_Iterator[1])(pIVar9);
  lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0x98))();
  local_110._16_8_ = local_110._16_8_ + local_a8;
  lVar11 = 0;
  lVar23 = 0;
  bVar22 = true;
  do {
    bVar6 = bVar22;
    p_Var14 = in_RDX->_vptr_Iterator[lVar11 * 3 + 0x18];
    uVar19 = (uint)((ulong)((long)in_RDX->_vptr_Iterator[lVar11 * 3 + 0x19] - (long)p_Var14) >> 3);
    if (0 < (int)uVar19) {
      uVar21 = 0;
      do {
        lVar23 = lVar23 + *(long *)(*(long *)(p_Var14 + uVar21 * 8) + 0x10);
        uVar21 = uVar21 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar21);
    }
    lVar11 = 1;
    bVar22 = false;
  } while (bVar6);
  pvVar5 = (in_RDX->cleanup_).arg1;
  lVar11 = (long)(in_RDX->cleanup_).arg2 - (long)pvVar5;
  if (lVar11 == 0) {
    lVar11 = 0;
  }
  else {
    lVar17 = (lVar11 >> 4) * -0x3333333333333333;
    lVar17 = lVar17 + (ulong)(lVar17 == 0);
    plVar15 = (long *)((long)pvVar5 + 8);
    lVar11 = 0;
    do {
      lVar11 = lVar11 + *plVar15;
      plVar15 = plVar15 + 10;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  port::Mutex::Lock((Mutex *)local_110._56_8_);
  lVar17 = (long)*(int *)in_RDX->_vptr_Iterator;
  (&compact[9].smallest_snapshot)[lVar17 * 3] =
       (&compact[9].smallest_snapshot)[lVar17 * 3] + (lVar10 - local_110._16_8_);
  p_Var1 = &(&compact[9].outputs)[lVar17].
            super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ;
  (p_Var1->_M_impl).super__Vector_impl_data._M_start =
       (pointer)((long)&((p_Var1->_M_impl).super__Vector_impl_data._M_start)->number + lVar23);
  ppOVar2 = &(&compact[9].outputs)[lVar17].
             super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppOVar2 = (pointer)((long)&(*ppOVar2)->number + lVar11);
  if (pp_Var12 == (_func_int **)0x0) {
    InstallCompactionResults((DBImpl *)&stack0xffffffffffffff68,compact);
    if ((Logger *)local_98 == (Logger *)0x0) goto LAB_0010960b;
    pp_Var12 = (_func_int **)Status::CopyState(local_98);
    (this->super_DB)._vptr_DB = pp_Var12;
    if ((Logger *)local_98 != (Logger *)0x0) {
      operator_delete__(local_98);
      pp_Var12 = (this->super_DB)._vptr_DB;
    }
    if (pp_Var12 == (_func_int **)0x0) goto LAB_0010960b;
  }
  RecordBackgroundError((DBImpl *)compact,(Status *)this);
LAB_0010960b:
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar16 = VersionSet::LevelSummary
                      ((VersionSet *)
                       compact[8].outputs.
                       super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (LevelSummaryStorage *)&stack0xffffffffffffff68);
  Log(info_log,"compacted to: %s",pcVar16);
  if ((Comparator *)local_110._24_8_ != (Comparator *)(local_110 + 0x28)) {
    operator_delete((void *)local_110._24_8_);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState *compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0),
      compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder==NULL);
  assert(compact->outfile==NULL);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->number_;
  }

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  Iterator *input = versions_->MakeInputIterator(compact->compaction);
  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  for (; input->Valid() && !shutting_down_.Acquire_Load();) {
    // Prioritize immutable compaction work
    if (has_imm_.NoBarrier_Load()!=NULL) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_!=NULL) {
        CompactMemTable();
        bg_cv_.SignalAll();  // Wakeup MakeRoomForWrite() if necessary
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder!=NULL) {//
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key,
                                     Slice(current_user_key))!=0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;    // (A)
      } else if (ikey.type==kTypeDeletion &&
          ikey.sequence <= compact->smallest_snapshot &&
          compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder==NULL) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries()==0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.Acquire_Load()) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder!=NULL) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = NULL;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log,
      "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}